

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

void Commands::Learn(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *arguments,Character *from)

{
  World *pWVar1;
  uchar uVar2;
  bool bVar3;
  int iVar4;
  const_reference pvVar5;
  size_type sVar6;
  mapped_type *this;
  int *piVar7;
  iterator __first;
  iterator __last;
  pointer pCVar8;
  undefined1 local_e8 [8];
  PacketBuilder builder_1;
  _Self local_98;
  _List_iterator<Character_Spell> it;
  PacketBuilder builder;
  allocator<char> local_49;
  key_type local_48;
  int local_24 [2];
  short local_1c;
  short local_1a;
  short level;
  Character *pCStack_18;
  short skill_id;
  Character *from_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  
  pCStack_18 = from;
  from_local = (Character *)arguments;
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](arguments,0);
  iVar4 = util::to_int(pvVar5);
  local_1a = (short)iVar4;
  local_1c = -1;
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)from_local);
  if (1 < sVar6) {
    local_24[1] = 0;
    pWVar1 = pCStack_18->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"MaxSkillLevel",&local_49);
    this = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar1->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_48);
    local_24[0] = util::variant::operator_cast_to_int(this);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)from_local,1);
    builder.add_size._0_4_ = util::to_int(pvVar5);
    piVar7 = std::min<int>(local_24,(int *)&builder.add_size);
    piVar7 = std::max<int>(local_24 + 1,piVar7);
    local_1c = (short)*piVar7;
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  bVar3 = Character::AddSpell(pCStack_18,local_1a);
  if (bVar3) {
    PacketBuilder::PacketBuilder((PacketBuilder *)&it,PACKET_STATSKILL,PACKET_TAKE,6);
    PacketBuilder::AddShort((PacketBuilder *)&it,(int)local_1a);
    iVar4 = Character::HasItem(pCStack_18,1,false);
    PacketBuilder::AddInt((PacketBuilder *)&it,iVar4);
    Character::Send(pCStack_18,(PacketBuilder *)&it);
    PacketBuilder::~PacketBuilder((PacketBuilder *)&it);
  }
  if (-1 < local_1c) {
    __first = std::begin<std::__cxx11::list<Character_Spell,std::allocator<Character_Spell>>>
                        (&pCStack_18->spells);
    __last = std::end<std::__cxx11::list<Character_Spell,std::allocator<Character_Spell>>>
                       (&pCStack_18->spells);
    local_98._M_node =
         (_List_node_base *)
         std::
         find_if<std::_List_iterator<Character_Spell>,Commands::Learn(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,Character*)::__0>
                   (__first._M_node,__last._M_node,(anon_class_8_1_679f5f47_for__M_pred)&local_1a);
    builder_1.add_size =
         (size_t)std::__cxx11::list<Character_Spell,_std::allocator<Character_Spell>_>::end
                           (&pCStack_18->spells);
    bVar3 = std::operator!=(&local_98,(_Self *)&builder_1.add_size);
    if (bVar3) {
      uVar2 = (uchar)local_1c;
      pCVar8 = std::_List_iterator<Character_Spell>::operator->(&local_98);
      pCVar8->level = uVar2;
      PacketBuilder::PacketBuilder((PacketBuilder *)local_e8,PACKET_STATSKILL,PACKET_ACCEPT,6);
      PacketBuilder::AddShort((PacketBuilder *)local_e8,pCStack_18->skillpoints);
      PacketBuilder::AddShort((PacketBuilder *)local_e8,(int)local_1a);
      pCVar8 = std::_List_iterator<Character_Spell>::operator->(&local_98);
      PacketBuilder::AddShort((PacketBuilder *)local_e8,(uint)pCVar8->level);
      Character::Send(pCStack_18,(PacketBuilder *)local_e8);
      PacketBuilder::~PacketBuilder((PacketBuilder *)local_e8);
    }
  }
  return;
}

Assistant:

void Learn(const std::vector<std::string>& arguments, Character* from)
{
	short skill_id = util::to_int(arguments[0]);
	short level = -1;

	if (arguments.size() >= 2)
		level = std::max(0, std::min<int>(from->world->config["MaxSkillLevel"], util::to_int(arguments[1])));

	if (from->AddSpell(skill_id))
	{
		PacketBuilder builder(PACKET_STATSKILL, PACKET_TAKE, 6);
		builder.AddShort(skill_id);
		builder.AddInt(from->HasItem(1));
		from->Send(builder);
	}

	if (level >= 0)
	{
		auto it = std::find_if(UTIL_RANGE(from->spells), [&](Character_Spell spell) { return spell.id == skill_id; });

		if (it != from->spells.end())
		{
			it->level = level;

			PacketBuilder builder(PACKET_STATSKILL, PACKET_ACCEPT, 6);
			builder.AddShort(from->skillpoints);
			builder.AddShort(skill_id);
			builder.AddShort(it->level);
			from->Send(builder);
		}
	}
}